

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkPointTriface::ConstraintsBiLoad_C
          (ChLinkPointTriface *this,double factor,double recovery_clamp,bool do_clamp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  element_type *peVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ChVector<double> result;
  undefined1 local_28 [16];
  double local_18;
  
  peVar12 = (this->mtriangle).mnodeB1.
            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar13 = (this->mtriangle).mnodeB2.
            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar14 = (this->mtriangle).mnodeB3.
            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar1 = *(double *)&(peVar12->super_ChNodeFEAbase).field_0x20;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1;
  auVar30._8_8_ = *(undefined8 *)&peVar12->field_0x30;
  auVar30._0_8_ = *(undefined8 *)&peVar12->field_0x30;
  auVar17 = vsubpd_avx(*(undefined1 (*) [16])&peVar13->field_0x28,
                       *(undefined1 (*) [16])&peVar12->field_0x28);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)&peVar14->field_0x30;
  auVar19 = vunpcklpd_avx(auVar30,auVar22);
  auVar16 = vmovhpd_avx(auVar27,*(undefined8 *)&(peVar14->super_ChNodeFEAbase).field_0x20);
  auVar19 = vsubpd_avx(auVar16,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(double *)&(peVar13->super_ChNodeFEAbase).field_0x20 - dVar1;
  auVar16 = vshufpd_avx(auVar17,auVar20,1);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(double *)&peVar14->field_0x28 - SUB168(*(undefined1 (*) [16])&peVar12->field_0x28,0);
  auVar21 = vunpcklpd_avx(auVar25,auVar19);
  auVar28._0_8_ = auVar21._0_8_ * auVar16._0_8_;
  auVar28._8_8_ = auVar21._8_8_ * auVar16._8_8_;
  local_28 = vfmsub231pd_fma(auVar28,auVar17,auVar19);
  auVar16 = vshufpd_avx(auVar19,auVar19,1);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar16._0_8_ * auVar17._0_8_;
  auVar16 = vfmsub231sd_fma(auVar23,auVar20,auVar25);
  local_18 = auVar16._0_8_;
  ChVector<double>::Normalize((ChVector<double> *)local_28);
  dVar1 = this->s2;
  dVar2 = this->s3;
  peVar12 = (this->mtriangle).mnodeB1.
            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar13 = (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  dVar3 = *(double *)&peVar13->field_0x28;
  dVar4 = *(double *)&peVar13->field_0x30;
  peVar14 = (this->mtriangle).mnodeB2.
            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar18 = (1.0 - dVar1) - dVar2;
  dVar5 = *(double *)&peVar12->field_0x28;
  dVar6 = *(double *)&peVar12->field_0x30;
  dVar7 = *(double *)&peVar14->field_0x28;
  dVar8 = *(double *)&peVar14->field_0x30;
  peVar15 = (this->mtriangle).mnodeB3.
            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar9 = *(double *)&peVar15->field_0x28;
  dVar10 = *(double *)&peVar15->field_0x30;
  dVar11 = this->d;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = factor;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (this->constraint1).super_ChConstraint.b_i;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (((*(double *)&(peVar13->super_ChNodeFEAbase).field_0x20 -
         dVar18 * *(double *)&(peVar12->super_ChNodeFEAbase).field_0x20) -
        dVar1 * *(double *)&(peVar14->super_ChNodeFEAbase).field_0x20) -
       dVar2 * *(double *)&(peVar15->super_ChNodeFEAbase).field_0x20) -
       dVar11 * (double)local_28._0_8_;
  auVar16 = vfmadd213sd_fma(auVar24,auVar29,auVar16);
  (this->constraint1).super_ChConstraint.b_i = auVar16._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (this->constraint2).super_ChConstraint.b_i;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (((dVar3 - dVar18 * dVar5) - dVar1 * dVar7) - dVar2 * dVar9) -
       dVar11 * (double)local_28._8_8_;
  auVar16 = vfmadd213sd_fma(auVar26,auVar29,auVar17);
  (this->constraint2).super_ChConstraint.b_i = auVar16._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (this->constraint3).super_ChConstraint.b_i;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (((dVar4 - dVar18 * dVar6) - dVar1 * dVar8) - dVar2 * dVar10) - dVar11 * local_18;
  auVar16 = vfmadd213sd_fma(auVar21,auVar29,auVar19);
  (this->constraint3).super_ChConstraint.b_i = auVar16._0_8_;
  return;
}

Assistant:

void ChLinkPointTriface::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    // Compute residual of constraint as distance of two points: one is A,
    // other is on triangle at the s2,s3 area coordinates:
    //  C = A - s1*B1 - s2*B2 - s3*B3
    // If an offset d is desired, along normal N, this becomes:
    //  C = A - s1*B1 - s2*B2 - s3*B3 - d*N

    ChVector<> N =
        Vcross(mtriangle.mnodeB2->pos - mtriangle.mnodeB1->pos, mtriangle.mnodeB3->pos - mtriangle.mnodeB1->pos);
    N.Normalize();
    double s1 = 1 - s2 - s3;

    ChVector<> res = mnodeA->GetPos() - s1 * mtriangle.mnodeB1->pos - s2 * mtriangle.mnodeB2->pos -
                     s3 * mtriangle.mnodeB3->pos - N * d;

    constraint1.Set_b_i(constraint1.Get_b_i() + factor * res.x());
    constraint2.Set_b_i(constraint2.Get_b_i() + factor * res.y());
    constraint3.Set_b_i(constraint3.Get_b_i() + factor * res.z());
}